

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * __thiscall pugi::xpath_variable::name(xpath_variable *this)

{
  uint uVar1;
  
  uVar1 = this->_type - xpath_type_node_set;
  if (uVar1 < 4) {
    return (char_t *)((long)&this->_type + *(long *)(&DAT_0043ecd8 + (ulong)uVar1 * 8));
  }
  __assert_fail("false && \"Invalid variable type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                ,0x3128,"const char_t *pugi::xpath_variable::name() const");
}

Assistant:

PUGI_IMPL_FN const char_t* xpath_variable::name() const
	{
		switch (_type)
		{
		case xpath_type_node_set:
			return static_cast<const impl::xpath_variable_node_set*>(this)->name;

		case xpath_type_number:
			return static_cast<const impl::xpath_variable_number*>(this)->name;

		case xpath_type_string:
			return static_cast<const impl::xpath_variable_string*>(this)->name;

		case xpath_type_boolean:
			return static_cast<const impl::xpath_variable_boolean*>(this)->name;

		default:
			assert(false && "Invalid variable type"); // unreachable
			return 0;
		}
	}